

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.cpp
# Opt level: O0

void __thiscall
LiteScript::_Type_ARRAY::Load
          (_Type_ARRAY *this,istream *stream,Object *object,offset_in_Memory_to_subr caller)

{
  Memory *pMVar1;
  byte bVar2;
  uint id;
  uint uVar3;
  Array *pAVar4;
  Variable *pVVar5;
  char *idx;
  long *plVar6;
  long in_R8;
  bool bVar7;
  code *local_168;
  code *local_118;
  Nullable<LiteScript::Variable> local_d0;
  uint local_b0;
  char local_a9;
  uint i_1;
  uchar c;
  string key;
  Nullable<LiteScript::Variable> local_88;
  uint local_68;
  uint local_64;
  uint i;
  uint sz;
  Array *obj;
  allocator<LiteScript::Array> local_41;
  code *pcStack_40;
  allocator<LiteScript::Array> allocator;
  offset_in_Memory_to_subr caller_local;
  Object *object_local;
  istream *stream_local;
  _Type_ARRAY *this_local;
  
  pcStack_40 = (code *)caller;
  Object::Reassign(object,(Type *)_type_array,0x38);
  std::allocator<LiteScript::Array>::allocator(&local_41);
  pAVar4 = Object::GetData<LiteScript::Array>(object);
  __gnu_cxx::new_allocator<LiteScript::Array>::construct<LiteScript::Array,LiteScript::Memory&>
            ((new_allocator<LiteScript::Array> *)&local_41,pAVar4,object->memory);
  _i = Object::GetData<LiteScript::Array>(object);
  local_64 = IStreamer::Read<unsigned_int>(stream);
  for (local_68 = 0; pAVar4 = _i, uVar3 = local_68, local_68 < local_64; local_68 = local_68 + 1) {
    pMVar1 = object->memory;
    plVar6 = (long *)((long)(pMVar1->arr)._M_elems + in_R8);
    if (((ulong)pcStack_40 & 1) == 0) {
      local_118 = pcStack_40;
    }
    else {
      local_118 = *(code **)(pcStack_40 + *plVar6 + -1);
    }
    id = (*local_118)(plVar6,stream);
    Memory::GetVariable(&local_88,pMVar1,id);
    pVVar5 = Nullable<LiteScript::Variable>::operator*(&local_88);
    Array::Add(pAVar4,uVar3,pVVar5);
    Nullable<LiteScript::Variable>::~Nullable(&local_88);
  }
  local_64 = IStreamer::Read<unsigned_int>(stream);
  std::__cxx11::string::string((string *)&i_1);
  for (local_b0 = 0; local_b0 < local_64; local_b0 = local_b0 + 1) {
    std::__cxx11::string::clear();
    while( true ) {
      bVar2 = std::ios::eof();
      bVar7 = false;
      if ((bVar2 & 1) == 0) {
        local_a9 = std::istream::get();
        bVar7 = local_a9 != '\0';
      }
      pAVar4 = _i;
      if (!bVar7) break;
      std::__cxx11::string::operator+=((string *)&i_1,local_a9);
    }
    idx = (char *)std::__cxx11::string::c_str();
    pMVar1 = object->memory;
    plVar6 = (long *)((long)(pMVar1->arr)._M_elems + in_R8);
    if (((ulong)pcStack_40 & 1) == 0) {
      local_168 = pcStack_40;
    }
    else {
      local_168 = *(code **)(pcStack_40 + *plVar6 + -1);
    }
    uVar3 = (*local_168)(plVar6,stream);
    Memory::GetVariable(&local_d0,pMVar1,uVar3);
    pVVar5 = Nullable<LiteScript::Variable>::operator*(&local_d0);
    Array::Add(pAVar4,idx,pVVar5);
    Nullable<LiteScript::Variable>::~Nullable(&local_d0);
  }
  std::__cxx11::string::~string((string *)&i_1);
  std::allocator<LiteScript::Array>::~allocator(&local_41);
  return;
}

Assistant:

void LiteScript::_Type_ARRAY::Load(std::istream &stream, Object &object, unsigned int (Memory::*caller)(std::istream&)) const {
    object.Reassign(Type::ARRAY, sizeof(Array));
    std::allocator<Array> allocator;
    allocator.construct(&object.GetData<Array>(), object.memory);
    Array& obj = object.GetData<Array>();
    unsigned int sz = IStreamer::Read<unsigned int>(stream);
    for (unsigned int i = 0; i < sz; i++)
        obj.Add(i, *object.memory.GetVariable((object.memory.*caller)(stream)));
    sz = IStreamer::Read<unsigned int>(stream);
    std::string key;
    unsigned char c;
    for (unsigned int i = 0; i < sz; i++) {
        key.clear();
        while (!stream.eof() && (c = (unsigned char)stream.get()) != 0)
            key += c;
        obj.Add(key.c_str(), *object.memory.GetVariable((object.memory.*caller)(stream)));
    }
}